

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_blind_switch
              (secp256k1_context *ctx,uchar *blind_switch,uchar *blind,uint64_t value,
              secp256k1_generator *value_gen,secp256k1_generator *blind_gen,
              secp256k1_pubkey *switch_pubkey)

{
  int iVar1;
  void *pvVar2;
  secp256k1_context *ctx_00;
  char *pcVar3;
  int overflow;
  size_t buflen;
  uchar buf [33];
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  secp256k1_sha256 local_148;
  secp256k1_pubkey tmp_pubkey;
  uchar hashed [32];
  secp256k1_pedersen_commitment commit;
  
  buflen = 0x21;
  if (blind_switch == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "blind_switch != NULL";
  }
  else if (blind == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "blind != NULL";
  }
  else if (value_gen == (secp256k1_generator *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "value_gen != NULL";
  }
  else if (blind_gen == (secp256k1_generator *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "blind_gen != NULL";
  }
  else {
    if (switch_pubkey != (secp256k1_pubkey *)0x0) {
      local_148.s[0] = 0x6a09e667;
      local_148.s[1] = 0xbb67ae85;
      local_148.s[2] = 0x3c6ef372;
      local_148.s[3] = 0xa54ff53a;
      local_148.s[4] = 0x510e527f;
      local_148.s[5] = 0x9b05688c;
      local_148.s[6] = 0x1f83d9ab;
      local_148.s[7] = 0x5be0cd19;
      local_148.bytes = 0;
      ctx_00 = ctx;
      iVar1 = secp256k1_pedersen_commit(ctx,&commit,blind,value,value_gen,blind_gen);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_pedersen_commitment_serialize(ctx_00,buf,&commit);
      secp256k1_sha256_write(&local_148,buf,0x21);
      tmp_pubkey.data._0_8_ = *(undefined8 *)switch_pubkey->data;
      tmp_pubkey.data._8_8_ = *(undefined8 *)(switch_pubkey->data + 8);
      tmp_pubkey.data._16_8_ = *(undefined8 *)(switch_pubkey->data + 0x10);
      tmp_pubkey.data._24_8_ = *(undefined8 *)(switch_pubkey->data + 0x18);
      tmp_pubkey.data._32_8_ = *(undefined8 *)(switch_pubkey->data + 0x20);
      tmp_pubkey.data._40_8_ = *(undefined8 *)(switch_pubkey->data + 0x28);
      tmp_pubkey.data._48_8_ = *(undefined8 *)(switch_pubkey->data + 0x30);
      tmp_pubkey.data._56_8_ = *(undefined8 *)(switch_pubkey->data + 0x38);
      iVar1 = secp256k1_ec_pubkey_tweak_mul(ctx,&tmp_pubkey,blind);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_ec_pubkey_serialize(ctx,buf,&buflen,&tmp_pubkey,0x102);
      if (iVar1 != 1) {
        return 0;
      }
      secp256k1_sha256_write(&local_148,buf,buflen);
      secp256k1_sha256_finalize(&local_148,hashed);
      secp256k1_scalar_set_b32(&local_168,hashed,&overflow);
      if (overflow != 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_188,blind,&overflow);
      if (overflow != 0) {
        return 0;
      }
      secp256k1_scalar_add(&local_168,&local_168,&local_188);
      secp256k1_scalar_get_b32(blind_switch,&local_168);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "switch_pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_blind_switch(const secp256k1_context* ctx, unsigned char* blind_switch, const unsigned char* blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen, const secp256k1_pubkey* switch_pubkey) {
    secp256k1_sha256 hasher;
    secp256k1_pedersen_commitment commit;
    unsigned char buf[33];
    size_t buflen = sizeof(buf);
    unsigned char hashed[32];
    int overflow;
    secp256k1_scalar blind_switch_scalar;
    secp256k1_pubkey tmp_pubkey;
    secp256k1_scalar tmp_scalar;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blind_switch != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    ARG_CHECK(switch_pubkey != NULL);

    secp256k1_sha256_initialize(&hasher);
    /* xG + vH */
    if (secp256k1_pedersen_commit(ctx, &commit, blind, value, value_gen, blind_gen) != 1) {
        return 0;
    }
    if (secp256k1_pedersen_commitment_serialize(ctx, buf, &commit) != 1) {
        return 0;
    }
    secp256k1_sha256_write(&hasher, buf, buflen);

    /* xJ */
    tmp_pubkey = *switch_pubkey;
    if (secp256k1_ec_pubkey_tweak_mul(ctx, &tmp_pubkey, blind) != 1) {
        return 0;
    }
    if (secp256k1_ec_pubkey_serialize(ctx, buf, &buflen, &tmp_pubkey, SECP256K1_EC_COMPRESSED) != 1) {
        return 0;
    }
    secp256k1_sha256_write(&hasher, buf, buflen);
    secp256k1_sha256_finalize(&hasher, hashed);
    secp256k1_scalar_set_b32(&blind_switch_scalar, hashed, &overflow); /* hash(xG+vH||xJ) */
    if (overflow) {
        secp256k1_scalar_clear(&blind_switch_scalar);
        return 0;
    }
    secp256k1_scalar_set_b32(&tmp_scalar, blind, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&blind_switch_scalar);
        secp256k1_scalar_clear(&tmp_scalar);
        return 0;
    }
    secp256k1_scalar_add(&blind_switch_scalar, &blind_switch_scalar, &tmp_scalar); /* x + hash(xG+vH||xJ) */
    secp256k1_scalar_get_b32(blind_switch, &blind_switch_scalar);
    secp256k1_scalar_clear(&blind_switch_scalar);
    secp256k1_scalar_clear(&tmp_scalar);
    return 1;
}